

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void * line_new(t_floatarg f,t_floatarg grain)

{
  t_object *owner;
  t_pd p_Var1;
  t_symbol *ptVar2;
  t_symbol *s2;
  _outlet *p_Var3;
  
  owner = (t_object *)pd_new(line_class);
  *(t_floatarg *)&owner[1].te_inlet = f;
  *(t_floatarg *)&owner[1].te_binbuf = f;
  *(undefined4 *)((long)&owner[1].te_inlet + 4) = 0;
  owner[2].te_g.g_pd = (t_pd)0x3ff0000000000000;
  p_Var1 = (t_pd)clock_new(owner,line_tick);
  owner[1].te_g.g_pd = p_Var1;
  p_Var3 = (_outlet *)clock_getsystime();
  owner[1].te_outlet = p_Var3;
  owner[1].te_g.g_next = (_gobj *)p_Var3;
  *(t_floatarg *)&owner[1].te_xpix = grain;
  ptVar2 = gensym("float");
  outlet_new(owner,ptVar2);
  ptVar2 = gensym("float");
  s2 = gensym("ft1");
  inlet_new(owner,(t_pd *)owner,ptVar2,s2);
  floatinlet_new(owner,(t_float *)&owner[1].te_xpix);
  return owner;
}

Assistant:

static void *line_new(t_floatarg f, t_floatarg grain)
{
    t_line *x = (t_line *)pd_new(line_class);
    x->x_targetval = x->x_setval = f;
    x->x_gotinlet = 0;
    x->x_1overtimediff = 1;
    x->x_clock = clock_new(x, (t_method)line_tick);
    x->x_targettime = x->x_prevtime = clock_getsystime();
    x->x_grain = grain;
    outlet_new(&x->x_obj, gensym("float"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    floatinlet_new(&x->x_obj, &x->x_grain);
    return (x);
}